

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<unsigned_char>::endsWith
          (ArrayPtr<unsigned_char> *this,ArrayPtr<const_unsigned_char> *other)

{
  bool bVar1;
  ArrayPtr<const_unsigned_char> local_10;
  
  local_10.size_ = other->size_;
  if (this->size_ < local_10.size_) {
    return false;
  }
  local_10.ptr = this->ptr + (this->size_ - local_10.size_);
  bVar1 = ArrayPtr<const_unsigned_char>::operator==(&local_10,other);
  return bVar1;
}

Assistant:

inline constexpr size_t size() const { return size_; }